

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O3

int __thiscall Jupiter::HTTP::Server::bind(Server *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  _Head_base<0UL,_Jupiter::Socket_*,_false> this_00;
  _func_int **pp_Var2;
  undefined4 in_register_00000034;
  _Head_base<0UL,_Jupiter::Socket_*,_false> local_50 [2];
  Socket local_40;
  
  this_00._M_head_impl = (Socket *)operator_new(0x10);
  TCPSocket::TCPSocket((TCPSocket *)this_00._M_head_impl);
  local_50[0]._M_head_impl = &local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,__addr,__addr->sa_data + CONCAT44(in_register_00000034,__fd) + -2);
  iVar1 = (*(this_00._M_head_impl)->_vptr_Socket[2])
                    (this_00._M_head_impl,local_50[0]._M_head_impl,(ulong)(__len & 0xffff),1);
  if (local_50[0]._M_head_impl != &local_40) {
    operator_delete(local_50[0]._M_head_impl,(long)local_40._vptr_Socket + 1);
  }
  if ((char)iVar1 == '\0') {
    pp_Var2 = (this_00._M_head_impl)->_vptr_Socket;
  }
  else {
    Socket::setBlocking(this_00._M_head_impl,false);
    local_50[0]._M_head_impl = this_00._M_head_impl;
    std::
    vector<std::unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>>,std::allocator<std::unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>>>>
    ::emplace_back<std::unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>>>
              ((vector<std::unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>>,std::allocator<std::unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>>>>
                *)&this->m_data->m_ports,
               (unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_> *)local_50);
    if (local_50[0]._M_head_impl == (Socket *)0x0) {
      return iVar1;
    }
    pp_Var2 = (local_50[0]._M_head_impl)->_vptr_Socket;
    this_00._M_head_impl = local_50[0]._M_head_impl;
  }
  (*pp_Var2[0xe])(this_00._M_head_impl);
  return iVar1;
}

Assistant:

bool Jupiter::HTTP::Server::bind(std::string_view hostname, uint16_t port) {
	auto socket = std::make_unique<Jupiter::TCPSocket>();
	if (socket->bind(static_cast<std::string>(hostname).c_str(), port, true)) {
		socket->setBlocking(false);
		m_data->m_ports.push_back(std::move(socket));
		return true;
	}

	return false;
}